

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

Var Js::JavascriptPromise::CreateThenPromise
              (JavascriptPromise *sourcePromise,RecyclableObject *fulfillmentHandler,
              RecyclableObject *rejectionHandler,ScriptContext *scriptContext)

{
  ImplicitCallFlags IVar1;
  RuntimeFunction *defaultConstructor;
  ThreadContext *this;
  code *pcVar2;
  bool bVar3;
  Attributes attributes;
  RuntimeFunction *instanceObj;
  undefined4 *puVar4;
  JavascriptPromiseCapability *capability;
  anon_class_16_2_93ddcb53_for_newObjectCreationFunction local_68;
  anon_class_16_2_93ddcb53_for_newObjectCreationFunction local_58;
  RecyclableObject *local_48;
  RecyclableObject *local_40;
  bool local_31;
  
  defaultConstructor =
       (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
       promiseConstructor.ptr;
  local_48 = rejectionHandler;
  local_40 = fulfillmentHandler;
  instanceObj = (RuntimeFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)sourcePromise,
                           &defaultConstructor->super_JavascriptFunction,scriptContext);
  bVar3 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5a4,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this = scriptContext->threadContext;
  local_68.constructor = (RecyclableObject *)instanceObj;
  local_68.scriptContext = scriptContext;
  if (instanceObj == defaultConstructor) {
    bVar3 = this->reentrancySafeOrHandled;
    this->reentrancySafeOrHandled = true;
    capability = anon_func::anon_class_16_1_2f014396::
                 anon_class_16_2_93ddcb53_for_newObjectCreationFunction::operator()(&local_68);
    this->reentrancySafeOrHandled = bVar3;
    goto LAB_00b9cf7d;
  }
  local_31 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_58.constructor = (RecyclableObject *)instanceObj;
  local_58.scriptContext = scriptContext;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)instanceObj);
  bVar3 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)instanceObj,attributes);
  if (bVar3) {
    capability = anon_func::anon_class_16_1_2f014396::
                 anon_class_16_2_93ddcb53_for_newObjectCreationFunction::operator()(&local_58);
    bVar3 = ThreadContext::IsOnStack(capability);
LAB_00b9ced1:
    if (bVar3 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      capability = anon_func::anon_class_16_1_2f014396::
                   anon_class_16_2_93ddcb53_for_newObjectCreationFunction::operator()(&local_58);
      bVar3 = ThreadContext::IsOnStack(capability);
      goto LAB_00b9ced1;
    }
    IVar1 = this->implicitCallFlags;
    capability = anon_func::anon_class_16_1_2f014396::
                 anon_class_16_2_93ddcb53_for_newObjectCreationFunction::operator()(&local_58);
    this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    capability = (JavascriptPromiseCapability *)
                 (((((((((instanceObj->super_JavascriptFunction).super_DynamicObject.
                         super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                     super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                  javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  this->reentrancySafeOrHandled = local_31;
LAB_00b9cf7d:
  PerformPromiseThen(sourcePromise,capability,local_40,local_48,scriptContext);
  return (capability->promise).ptr;
}

Assistant:

Var JavascriptPromise::CreateThenPromise(JavascriptPromise* sourcePromise, RecyclableObject* fulfillmentHandler, RecyclableObject* rejectionHandler, ScriptContext* scriptContext)
    {
        JavascriptFunction* defaultConstructor = scriptContext->GetLibrary()->GetPromiseConstructor();
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(sourcePromise, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        JavascriptPromiseCapability* promiseCapability = (JavascriptPromiseCapability*)JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->JavascriptPromiseCapability*
        {
            return NewPromiseCapability(constructor, scriptContext);
        });

        PerformPromiseThen(sourcePromise, promiseCapability, fulfillmentHandler, rejectionHandler, scriptContext);

        return promiseCapability->GetPromise();
    }